

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info1394.c
# Opt level: O0

int main(int argc,char **argv)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  void *__ptr;
  int id;
  int rc;
  int i;
  int nports;
  raw1394_portinfo *ports;
  raw1394handle_t handle;
  char **argv_local;
  int argc_local;
  
  lVar4 = raw1394_new_handle();
  if (lVar4 == 0) {
    fprintf(_stderr,"**** Error: could not open 1394 handle\n");
    exit(-1);
  }
  iVar2 = raw1394_get_port_info(lVar4,0,0);
  if (iVar2 < 0) {
    fprintf(_stderr,"**** Error: could not get port info\n");
    exit(-1);
  }
  __ptr = malloc((long)iVar2 * 0x24);
  iVar2 = raw1394_get_port_info(lVar4,__ptr,iVar2);
  for (id = 0; id < iVar2; id = id + 1) {
    printf("Port %d: %s (%d nodes)",(ulong)(uint)id,(long)__ptr + (long)id * 0x24 + 4,
           (ulong)*(uint *)((long)__ptr + (long)id * 0x24));
    if (id == 0) {
      iVar3 = raw1394_set_port(lVar4,0);
      if (iVar3 == 0) {
        uVar1 = raw1394_get_local_id(lVar4);
        printf(", local id 0x%4X (%d)",(ulong)(uint)uVar1,(ulong)(uVar1 & 0x3f));
      }
      printf("\n");
    }
  }
  free(__ptr);
  raw1394_destroy_handle(lVar4);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    raw1394handle_t handle;
    struct raw1394_portinfo *ports;
    int nports;
    int i, rc;

    /* get handle to device and check for errors */
    handle = raw1394_new_handle();
    if (handle == NULL) {
        fprintf(stderr, "**** Error: could not open 1394 handle\n");
        exit(-1);
    }

    /* get number of ports and check for errors */
    nports = raw1394_get_port_info(handle, NULL, 0);
    if (nports < 0) {
        fprintf(stderr, "**** Error: could not get port info\n");
        exit(-1);
    }

    ports = (struct raw1394_portinfo *) malloc(nports*sizeof(struct raw1394_portinfo));
    nports = raw1394_get_port_info(handle, ports, nports);
    for (i = 0; i < nports; i++) {
      printf("Port %d: %s (%d nodes)", i, ports[i].name, ports[i].nodes);
      if (i == 0) {
          rc = raw1394_set_port(handle, i);
          if (!rc) {
              int id = raw1394_get_local_id(handle);
              printf(", local id 0x%4X (%d)", id, id&0x3f);
          }
          printf("\n");
      }
    }
    free(ports);

    raw1394_destroy_handle(handle);
    return 0;
}